

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii-parser-basetype.cc
# Opt level: O1

bool __thiscall
tinyusdz::ascii::AsciiParser::ParseBasicTypeArray<tinyusdz::value::StringData>
          (AsciiParser *this,
          vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_> *result)

{
  bool bVar1;
  bool bVar2;
  undefined8 in_RAX;
  char c;
  char local_11;
  
  local_11 = (char)((ulong)in_RAX >> 0x38);
  bVar2 = Expect(this,'[');
  if (!bVar2) {
    return false;
  }
  bVar2 = SkipCommentAndWhitespaceAndNewline(this,true);
  if (!bVar2) {
    return false;
  }
  bVar2 = Char1(this,&local_11);
  if (bVar2) {
    if (local_11 != ']') {
      bVar2 = Rewind(this,1);
      bVar1 = true;
      goto LAB_00406f8f;
    }
    ::std::vector<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>::
    _M_erase_at_end(result,(result->
                           super__Vector_base<tinyusdz::value::StringData,_std::allocator<tinyusdz::value::StringData>_>
                           )._M_impl.super__Vector_impl_data._M_start);
    bVar2 = true;
  }
  else {
    bVar2 = false;
  }
  bVar1 = false;
LAB_00406f8f:
  if (!bVar1) {
    return bVar2;
  }
  bVar2 = SepBy1BasicType<tinyusdz::value::StringData>(this,',',']',result);
  if ((bVar2) && (bVar2 = SkipCommentAndWhitespaceAndNewline(this,true), bVar2)) {
    bVar2 = Expect(this,']');
    return bVar2;
  }
  return false;
}

Assistant:

bool AsciiParser::ParseBasicTypeArray(std::vector<T> *result) {
  if (!Expect('[')) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  // Empty array?
  {
    char c;
    if (!Char1(&c)) {
      return false;
    }

    if (c == ']') {
      result->clear();
      return true;
    }

    Rewind(1);
  }

  if (!SepBy1BasicType<T>(',', ']', result)) {
    return false;
  }

  if (!SkipCommentAndWhitespaceAndNewline()) {
    return false;
  }

  if (!Expect(']')) {
    return false;
  }
  return true;
}